

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScannerException.cpp
# Opt level: O0

void __thiscall ScannerException::ScannerException(ScannerException *this)

{
  undefined8 *in_RDI;
  allocator *s;
  ANTLRException *in_stack_ffffffffffffffc0;
  allocator local_29;
  string local_28 [40];
  
  s = &local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"scanner error",s);
  ANTLRException::ANTLRException(in_stack_ffffffffffffffc0,(string *)s);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  *in_RDI = &PTR__ScannerException_0036cbf8;
  return;
}

Assistant:

ScannerException::ScannerException()
: ANTLRException("scanner error")
{}